

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

void __thiscall ExprTree::setOutput(ExprTree *this,VarnodeTpl *newout)

{
  OpTpl *pOVar1;
  VarnodeTpl *pVVar2;
  LowlevelError *this_00;
  allocator local_59;
  OpTpl *op;
  string local_50;
  
  pVVar2 = this->outvn;
  if (pVVar2 != (VarnodeTpl *)0x0) {
    if (pVVar2->unnamed_flag == true) {
      operator_delete(pVVar2);
      pOVar1 = (this->ops->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
               super__Vector_impl_data._M_finish[-1];
      op = pOVar1;
      OpTpl::clearOutput(pOVar1);
      pOVar1->output = newout;
    }
    else {
      pOVar1 = (OpTpl *)operator_new(0x28);
      (pOVar1->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pOVar1->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pOVar1->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pOVar1->opc = CPUI_COPY;
      pOVar1->output = (VarnodeTpl *)0x0;
      op = pOVar1;
      OpTpl::addInput(pOVar1,pVVar2);
      pOVar1->output = newout;
      std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back(this->ops,&op);
    }
    pVVar2 = (VarnodeTpl *)operator_new(0x68);
    VarnodeTpl::VarnodeTpl(pVVar2,newout);
    this->outvn = pVVar2;
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_50,"Expression has no output",&local_59);
  LowlevelError::LowlevelError(this_00,&local_50);
  __cxa_throw(this_00,&SleighError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void ExprTree::setOutput(VarnodeTpl *newout)

{				// Force the output of the expression to be new out
				// If the original output is named, this requires
				// an extra COPY op
  OpTpl *op;
  if (outvn == (VarnodeTpl *)0)
    throw SleighError("Expression has no output");
  if (outvn->isUnnamed()) {
    delete outvn;
    op = ops->back();
    op->clearOutput();
    op->setOutput(newout);
  }
  else {
    op = new OpTpl(CPUI_COPY);
    op->addInput(outvn);
    op->setOutput(newout);
    ops->push_back(op);
  }
  outvn = new VarnodeTpl(*newout);
}